

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

FTexture * FTexture::CreateTexture(int lumpnum,int usetype)

{
  int iVar1;
  int iVar2;
  int h;
  int w;
  FTexture *tex;
  size_t i;
  FWadLump data;
  int usetype_local;
  int lumpnum_local;
  
  if (lumpnum == -1) {
    _usetype_local = (FTexture *)0x0;
  }
  else {
    data.Lump._0_4_ = usetype;
    data.Lump._4_4_ = lumpnum;
    FWadCollection::OpenLumpNum((FWadLump *)&i,&Wads,lumpnum);
    for (tex = (FTexture *)0x0; tex < (FTexture *)0xc;
        tex = (FTexture *)((long)&tex->_vptr_FTexture + 1)) {
      if (((CreateTexture::CreateInfo[(long)tex].usetype == (int)data.Lump) ||
          (CreateTexture::CreateInfo[(long)tex].usetype == 0)) &&
         (_usetype_local =
               (*CreateTexture::CreateInfo[(long)tex].TryCreate)((FileReader *)&i,data.Lump._4_4_),
         _usetype_local != (FTexture *)0x0)) {
        _usetype_local->UseType = (BYTE)(int)data.Lump;
        if ((int)data.Lump == 2) {
          iVar1 = GetWidth(_usetype_local);
          iVar2 = GetHeight(_usetype_local);
          if ((iVar1 == 0x80) && (iVar2 == 0x80)) {
            (_usetype_local->Scale).Y = 2.0;
            (_usetype_local->Scale).X = 2.0;
            *(ushort *)&_usetype_local->field_0x31 =
                 *(ushort *)&_usetype_local->field_0x31 & 0xfffb | 4;
          }
          else if ((iVar1 == 0x100) && (iVar2 == 0x100)) {
            (_usetype_local->Scale).Y = 4.0;
            (_usetype_local->Scale).X = 4.0;
            *(ushort *)&_usetype_local->field_0x31 =
                 *(ushort *)&_usetype_local->field_0x31 & 0xfffb | 4;
          }
        }
        goto LAB_008740a8;
      }
    }
    _usetype_local = (FTexture *)0x0;
LAB_008740a8:
    FWadLump::~FWadLump((FWadLump *)&i);
  }
  return _usetype_local;
}

Assistant:

FTexture * FTexture::CreateTexture (int lumpnum, int usetype)
{
	static TexCreateInfo CreateInfo[]={
		{ IMGZTexture_TryCreate,		TEX_Any },
		{ PNGTexture_TryCreate,			TEX_Any },
		{ JPEGTexture_TryCreate,		TEX_Any },
		{ DDSTexture_TryCreate,			TEX_Any },
		{ PCXTexture_TryCreate,			TEX_Any },
		{ TGATexture_TryCreate,			TEX_Any },
		{ RawPageTexture_TryCreate,		TEX_MiscPatch },
		{ FlatTexture_TryCreate,		TEX_Flat },
		{ PatchTexture_TryCreate,		TEX_Any },
		{ EmptyTexture_TryCreate,		TEX_Any },
		{ AutomapTexture_TryCreate,		TEX_MiscPatch },
		{ CELTexture_TryCreate,			TEX_Any },
	};

	if (lumpnum == -1) return NULL;

	FWadLump data = Wads.OpenLumpNum (lumpnum);

	for(size_t i = 0; i < countof(CreateInfo); i++)
	{
		if ((CreateInfo[i].usetype == usetype || CreateInfo[i].usetype == TEX_Any))
		{
			FTexture * tex = CreateInfo[i].TryCreate(data, lumpnum);
			if (tex != NULL) 
			{
				tex->UseType = usetype;
				if (usetype == FTexture::TEX_Flat) 
				{
					int w = tex->GetWidth();
					int h = tex->GetHeight();

					// Auto-scale flats with dimensions 128x128 and 256x256.
					// In hindsight, a bad idea, but RandomLag made it sound better than it really is.
					// Now we're stuck with this stupid behaviour.
					if (w==128 && h==128) 
					{
						tex->Scale.X = tex->Scale.Y = 2;
						tex->bWorldPanning = true;
					}
					else if (w==256 && h==256) 
					{
						tex->Scale.X = tex->Scale.Y = 4;
						tex->bWorldPanning = true;
					}
				}
				return tex;
			}
		}
	}
	return NULL;
}